

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       *this,ostream *o,bool pretty_print,uint indent_step,uint current_indent)

{
  value_t vVar1;
  bool bVar2;
  ulong uVar3;
  pointer ppVar4;
  pointer this_00;
  DecimalSeparator *pDVar5;
  ostream *poVar6;
  void *this_01;
  char *pcVar7;
  string local_630 [36];
  int local_60c;
  locale local_608;
  locale local_600;
  locale local_5f8;
  stringstream local_5f0 [8];
  stringstream ss_1;
  ostream local_5e0 [376];
  string local_468 [36];
  int local_444;
  locale local_440;
  locale local_438;
  locale local_430;
  stringstream local_428 [8];
  stringstream ss;
  ostream local_418 [376];
  int local_2a0;
  int local_29c;
  int i_2;
  int len;
  char buf [263];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
  local_f8;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
  local_f0;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
  local_e8;
  const_iterator i_1;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  local_98 [3];
  allocator local_61;
  string local_60 [32];
  _Self local_40;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  uint new_indent;
  uint current_indent_local;
  uint indent_step_local;
  bool pretty_print_local;
  ostream *o_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  
  i._M_node._0_4_ = current_indent;
  i._M_node._4_4_ = current_indent;
  vVar1 = nlohmann::basic_json::type_data_t::operator_cast_to_value_t((type_data_t *)this);
  switch(vVar1) {
  case null:
    std::operator<<(o,"null");
    break;
  case object:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.object != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x1787,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
            ::empty((this->m_value).object);
    if (bVar2) {
      std::operator<<(o,"{}");
    }
    else {
      std::operator<<(o,"{");
      if (pretty_print) {
        i._M_node._0_4_ = indent_step + (uint)i._M_node;
        std::operator<<(o,"\n");
      }
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
           ::cbegin((this->m_value).object);
      while( true ) {
        local_38._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
             ::cend((this->m_value).object);
        bVar2 = std::operator!=(&local_30,&local_38);
        if (!bVar2) break;
        local_40._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
             ::cbegin((this->m_value).object);
        bVar2 = std::operator!=(&local_30,&local_40);
        if (bVar2) {
          pcVar7 = ",";
          if (pretty_print) {
            pcVar7 = ",\n";
          }
          std::operator<<(o,pcVar7);
        }
        uVar3 = (ulong)(uint)i._M_node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,uVar3,' ',&local_61);
        poVar6 = std::operator<<(o,local_60);
        poVar6 = std::operator<<(poVar6,"\"");
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                 ::operator->(&local_30);
        escape_string(local_98,&ppVar4->first);
        poVar6 = std::operator<<(poVar6,(string *)local_98);
        poVar6 = std::operator<<(poVar6,"\":");
        pcVar7 = "";
        if (pretty_print) {
          pcVar7 = " ";
        }
        std::operator<<(poVar6,pcVar7);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                 ::operator->(&local_30);
        dump(&ppVar4->second,o,pretty_print,indent_step,(uint)i._M_node);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        ::operator++(&local_30);
      }
      if (pretty_print) {
        i._M_node._0_4_ = (uint)i._M_node - indent_step;
        std::operator<<(o,"\n");
      }
      uVar3 = (ulong)(uint)i._M_node;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,uVar3,' ',(allocator *)((long)&i_1._M_current + 7));
      std::operator+(local_b8,(char *)local_d8);
      std::operator<<(o,(string *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
    }
    break;
  case array:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.array != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17b1,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    bVar2 = std::
            vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
            ::empty((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                     *)(this->m_value).object);
    if (bVar2) {
      std::operator<<(o,"[]");
    }
    else {
      std::operator<<(o,"[");
      if (pretty_print) {
        i._M_node._0_4_ = indent_step + (uint)i._M_node;
        std::operator<<(o,"\n");
      }
      local_e8._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
            *)std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
              ::cbegin((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                        *)(this->m_value).object);
      while( true ) {
        local_f0._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
              *)std::
                vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                ::cend((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                        *)(this->m_value).object);
        bVar2 = __gnu_cxx::operator!=(&local_e8,&local_f0);
        if (!bVar2) break;
        local_f8._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
              *)std::
                vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                ::cbegin((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                          *)(this->m_value).object);
        bVar2 = __gnu_cxx::operator!=(&local_e8,&local_f8);
        if (bVar2) {
          pcVar7 = ",";
          if (pretty_print) {
            pcVar7 = ",\n";
          }
          std::operator<<(o,pcVar7);
        }
        uVar3 = (ulong)(uint)i._M_node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,uVar3,' ',&local_119);
        std::operator<<(o,local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        this_00 = __gnu_cxx::
                  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
                  ::operator->(&local_e8);
        dump(this_00,o,pretty_print,indent_step,(uint)i._M_node);
        __gnu_cxx::
        __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
        ::operator++(&local_e8);
      }
      if (pretty_print) {
        i._M_node._0_4_ = (uint)i._M_node - indent_step;
        std::operator<<(o,"\n");
      }
      uVar3 = (ulong)(uint)i._M_node;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,uVar3,' ',&local_141);
      poVar6 = std::operator<<(o,local_140);
      std::operator<<(poVar6,"]");
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    break;
  case string:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.string != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17d9,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"\"",&local_169);
    poVar6 = std::operator<<(o,local_168);
    escape_string((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                   *)(buf + 0x100),(this->m_value).string);
    poVar6 = std::operator<<(poVar6,(string *)(buf + 0x100));
    std::operator<<(poVar6,"\"");
    std::__cxx11::string::~string((string *)(buf + 0x100));
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    break;
  case boolean:
    pcVar7 = "false";
    if (((this->m_value).boolean & 1U) != 0) {
      pcVar7 = "true";
    }
    std::operator<<(o,pcVar7);
    break;
  case number_integer:
    std::ostream::operator<<(o,(this->m_value).number_integer);
    break;
  case number_unsigned:
    std::ostream::operator<<(o,(this->m_value).number_unsigned);
    break;
  case number_float:
    if (((this->m_type).data >> 4 & 1) == 0) {
      if (((this->m_value).number_float != 0.0) || (NAN((this->m_value).number_float))) {
        std::__cxx11::stringstream::stringstream(local_5f0);
        std::locale::locale(&local_608);
        pDVar5 = (DecimalSeparator *)operator_new(0x18);
        anon_unknown_3::DecimalSeparator::DecimalSeparator(pDVar5);
        std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                  (&local_600,&local_608,pDVar5);
        std::ios::imbue(&local_5f8);
        std::locale::~locale(&local_5f8);
        std::locale::~locale(&local_600);
        std::locale::~locale(&local_608);
        local_60c = (int)std::setprecision(0xf);
        poVar6 = std::operator<<(local_5e0,(_Setprecision)local_60c);
        std::ostream::operator<<(poVar6,(this->m_value).number_float);
        std::__cxx11::stringstream::str();
        std::operator<<(o,local_630);
        std::__cxx11::string::~string(local_630);
        std::__cxx11::stringstream::~stringstream(local_5f0);
      }
      else {
        bVar2 = std::signbit((this->m_value).number_float);
        pcVar7 = "0.0";
        if (bVar2) {
          pcVar7 = "-0.0";
        }
        std::operator<<(o,pcVar7);
      }
    }
    else if (((this->m_type).data >> 5 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_428);
      std::locale::locale(&local_440);
      pDVar5 = (DecimalSeparator *)operator_new(0x18);
      anon_unknown_3::DecimalSeparator::DecimalSeparator(pDVar5);
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                (&local_438,&local_440,pDVar5);
      std::ios::imbue(&local_430);
      std::locale::~locale(&local_430);
      std::locale::~locale(&local_438);
      std::locale::~locale(&local_440);
      local_444 = (int)std::setprecision((uint)*(byte *)((long)&this->m_type + 1));
      poVar6 = std::operator<<(local_418,(_Setprecision)local_444);
      this_01 = (void *)std::ostream::operator<<(poVar6,std::fixed);
      std::ostream::operator<<(this_01,(this->m_value).number_float);
      std::__cxx11::stringstream::str();
      std::operator<<(o,local_468);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::stringstream::~stringstream(local_428);
    }
    else {
      if (((this->m_type).data >> 7 & 1) == 0) {
        local_29c = snprintf((char *)&i_2,0x107,"%.*e",(this->m_value).object,
                             (ulong)((this->m_type).data >> 8));
      }
      else {
        local_29c = snprintf((char *)&i_2,0x107,"%.*E",(this->m_value).object,
                             (ulong)((this->m_type).data >> 8));
      }
      local_29c = local_29c + 1;
      if (((this->m_type).data >> 6 & 1) == 0) {
        if (0x107 < local_29c) {
          local_29c = 0x107;
        }
        for (local_2a0 = 0; local_2a0 < local_29c; local_2a0 = local_2a0 + 1) {
          if (*(char *)((long)&i_2 + (long)local_2a0) == '+') {
            for (; local_2a0 + 1 < local_29c; local_2a0 = local_2a0 + 1) {
              *(undefined1 *)((long)&i_2 + (long)local_2a0) =
                   *(undefined1 *)((long)&i_2 + (long)(local_2a0 + 1));
            }
          }
        }
      }
      std::operator<<(o,(char *)&i_2);
    }
    break;
  case discarded:
    std::operator<<(o,"<discarded>");
  }
  return;
}

Assistant:

void dump(std::ostream& o,
                  const bool pretty_print,
                  const unsigned int indent_step,
                  const unsigned int current_indent = 0) const
        {
            // variable to hold indentation for recursive calls
            unsigned int new_indent = current_indent;

            switch (m_type)
            {
                case value_t::object:
                {
                    assert(m_value.object != nullptr);

                    if (m_value.object->empty())
                    {
                        o << "{}";
                        return;
                    }

                    o << "{";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.object->cbegin(); i != m_value.object->cend(); ++i)
                    {
                        if (i != m_value.object->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ') << "\""
                        << escape_string(i->first) << "\":"
                        << (pretty_print ? " " : "");
                        i->second.dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') + "}";
                    return;
                }

                case value_t::array:
                {
                    assert(m_value.array != nullptr);

                    if (m_value.array->empty())
                    {
                        o << "[]";
                        return;
                    }

                    o << "[";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.array->cbegin(); i != m_value.array->cend(); ++i)
                    {
                        if (i != m_value.array->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ');
                        i->dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') << "]";
                    return;
                }

                case value_t::string:
                {
                    assert(m_value.string != nullptr);
                    o << string_t("\"") << escape_string(*m_value.string) << "\"";
                    return;
                }

                case value_t::boolean:
                {
                    o << (m_value.boolean ? "true" : "false");
                    return;
                }

                case value_t::number_integer:
                {
                    o << m_value.number_integer;
                    return;
                }

                case value_t::number_unsigned:
                {
                    o << m_value.number_unsigned;
                    return;
                }

                case value_t::number_float:
                {
                    // check if number was parsed from a string
                    if (m_type.bits.parsed)
                    {
                        // check if parsed number had an exponent given
                        if (m_type.bits.has_exp)
                        {
                            // buffer size: precision (2^8-1 = 255) + other ('-.e-xxx' = 7) + null (1)
                            char buf[263];
                            int len;

                            // handle capitalization of the exponent
                            if (m_type.bits.exp_cap)
                            {
                                len = snprintf(buf, sizeof(buf), "%.*E",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }
                            else
                            {
                                len = snprintf(buf, sizeof(buf), "%.*e",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }

                            // remove '+' sign from the exponent if necessary
                            if (not m_type.bits.exp_plus)
                            {
                                if (len > static_cast<int>(sizeof(buf)))
                                {
                                    len = sizeof(buf);
                                }
                                for (int i = 0; i < len; i++)
                                {
                                    if (buf[i] == '+')
                                    {
                                        for (; i + 1 < len; i++)
                                        {
                                            buf[i] = buf[i + 1];
                                        }
                                    }
                                }
                            }

                            o << buf;
                        }
                        else
                        {
                            // no exponent - output as a decimal
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(m_type.bits.precision)
                            << std::fixed << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    else
                    {
                        if (m_value.number_float == 0)
                        {
                            // special case for zero to get "0.0"/"-0.0"
                            o << (std::signbit(m_value.number_float) ? "-0.0" : "0.0");
                        }
                        else
                        {
                            // Otherwise 6, 15 or 16 digits of precision allows
                            // round-trip IEEE 754 string->float->string,
                            // string->double->string or string->long double->string;
                            // to be safe, we read this value from
                            // std::numeric_limits<number_float_t>::digits10
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(std::numeric_limits<double>::digits10)
                            << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    return;
                }

                case value_t::discarded:
                {
                    o << "<discarded>";
                    return;
                }

                case value_t::null:
                {
                    o << "null";
                    return;
                }
            }
        }